

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::EraseLockedUTXO(WalletBatch *this,COutPoint *output)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)(output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar5 = *(undefined8 *)((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar1 = output->n;
  std::__cxx11::string::string
            ((string *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::LOCKED_UTXO_abi_cxx11_);
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar2;
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar3;
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar4;
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar5;
  local_68.second.second = uVar1;
  bVar6 = EraseIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>>
                    (this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseLockedUTXO(const COutPoint& output)
{
    return EraseIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)));
}